

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void constInsert(WhereConst *pConst,Expr *pColumn,Expr *pValue,Expr *pExpr)

{
  int iVar1;
  char cVar2;
  CollSeq *pCVar3;
  ulong uVar4;
  Expr **ppEVar5;
  ulong uVar6;
  long lVar7;
  
  if ((((pColumn->flags & 0x20) == 0) && (cVar2 = sqlite3ExprAffinity(pValue), cVar2 == '\0')) &&
     ((pCVar3 = sqlite3ExprCompareCollSeq(pConst->pParse,pExpr), pCVar3 == (CollSeq *)0x0 ||
      (pCVar3->xCmp == binCollFunc)))) {
    uVar6 = 0;
    uVar4 = (ulong)(uint)pConst->nConst;
    if (pConst->nConst < 1) {
      uVar4 = uVar6;
    }
    for (; uVar4 * 0x10 != uVar6; uVar6 = uVar6 + 0x10) {
      lVar7 = *(long *)((long)pConst->apExpr + uVar6);
      if ((*(int *)(lVar7 + 0x2c) == pColumn->iTable) &&
         (*(short *)(lVar7 + 0x30) == pColumn->iColumn)) {
        return;
      }
    }
    cVar2 = sqlite3ExprAffinity(pColumn);
    if (cVar2 == 'A') {
      pConst->bHasAffBlob = 1;
    }
    lVar7 = (long)pConst->nConst + 1;
    pConst->nConst = (int)lVar7;
    ppEVar5 = (Expr **)sqlite3DbReallocOrFree(pConst->pParse->db,pConst->apExpr,lVar7 * 0x10);
    pConst->apExpr = ppEVar5;
    if (ppEVar5 == (Expr **)0x0) {
      pConst->nConst = 0;
    }
    else {
      iVar1 = pConst->nConst;
      ppEVar5[(long)iVar1 * 2 + -2] = pColumn;
      pConst->apExpr[(long)iVar1 * 2 + -1] = pValue;
    }
  }
  return;
}

Assistant:

static void constInsert(
  WhereConst *pConst,  /* The WhereConst into which we are inserting */
  Expr *pColumn,       /* The COLUMN part of the constraint */
  Expr *pValue,        /* The VALUE part of the constraint */
  Expr *pExpr          /* Overall expression: COLUMN=VALUE or VALUE=COLUMN */
){
  int i;
  assert( pColumn->op==TK_COLUMN );
  assert( sqlite3ExprIsConstant(pValue) );

  if( ExprHasProperty(pColumn, EP_FixedCol) ) return;
  if( sqlite3ExprAffinity(pValue)!=0 ) return;
  if( !sqlite3IsBinary(sqlite3ExprCompareCollSeq(pConst->pParse,pExpr)) ){
    return;
  }

  /* 2018-10-25 ticket [cf5ed20f]
  ** Make sure the same pColumn is not inserted more than once */
  for(i=0; i<pConst->nConst; i++){
    const Expr *pE2 = pConst->apExpr[i*2];
    assert( pE2->op==TK_COLUMN );
    if( pE2->iTable==pColumn->iTable
     && pE2->iColumn==pColumn->iColumn
    ){
      return;  /* Already present.  Return without doing anything. */
    }
  }
  if( sqlite3ExprAffinity(pColumn)==SQLITE_AFF_BLOB ){
    pConst->bHasAffBlob = 1;
  }

  pConst->nConst++;
  pConst->apExpr = sqlite3DbReallocOrFree(pConst->pParse->db, pConst->apExpr,
                         pConst->nConst*2*sizeof(Expr*));
  if( pConst->apExpr==0 ){
    pConst->nConst = 0;
  }else{
    pConst->apExpr[pConst->nConst*2-2] = pColumn;
    pConst->apExpr[pConst->nConst*2-1] = pValue;
  }
}